

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O3

void emit_op_loadk(function *fn,int A,int Bx,int pc)

{
  TValue *pTVar1;
  LuaType LVar2;
  TValue *pTVar3;
  membuff_t *mb;
  
  emit_reg(fn,"ra",A);
  mb = &fn->body;
  pTVar3 = fn->p->k;
  pTVar1 = pTVar3 + (uint)Bx;
  LVar2 = pTVar3[(uint)Bx].tt_;
  if (LVar2 == 1) {
    membuff_add_fstring(mb,"setbvalue(ra, %d);\n",(ulong)(uint)(pTVar1->value_).b);
    return;
  }
  if (LVar2 != 3) {
    if (LVar2 == 0x13) {
      membuff_add_fstring(mb,"setivalue(ra, %lld);\n",(pTVar1->value_).gc);
      return;
    }
    membuff_add_fstring(mb,"rb = K(%d);\n",(ulong)(uint)Bx);
    membuff_add_fstring(mb,"setobj2s(L, ra, rb);\n");
    return;
  }
  membuff_add_fstring(mb,"setfltvalue(ra, %.17g);\n",(pTVar1->value_).gc);
  return;
}

Assistant:

static void emit_op_loadk(struct function *fn, int A, int Bx, int pc) {
  emit_reg(fn, "ra", A);
  (void)pc;
  TValue *Konst = &fn->p->k[Bx];
  switch (Konst->tt_) {
    case LUA_TNUMINT:
      membuff_add_fstring(&fn->body, "setivalue(ra, %lld);\n", Konst->value_.i);
      break;
    case LUA_TNUMFLT:
      membuff_add_fstring(&fn->body, "setfltvalue(ra, %.17g);\n", Konst->value_.n);
      break;
    case LUA_TBOOLEAN:
      membuff_add_fstring(&fn->body, "setbvalue(ra, %d);\n", Konst->value_.b);
      break;
    default: {
      membuff_add_fstring(&fn->body, "rb = K(%d);\n", Bx);
      membuff_add_fstring(&fn->body, "setobj2s(L, ra, rb);\n");
      break;
    }
  }
}